

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_file.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::FileGenerator::GenerateGlobalSource
          (FileGenerator *this,Printer *printer)

{
  Options *options;
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  Options *in_RCX;
  int i;
  ulong uVar4;
  undefined1 local_a8 [8];
  Formatter format;
  NamespaceOpener ns;
  
  local_a8 = (undefined1  [8])printer;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&format,&(this->variables_)._M_t);
  GenerateSourceIncludes(this,printer);
  GenerateTables(this,printer);
  options = &this->options_;
  bVar3 = HasDescriptorMethods(this->file_,options);
  if (bVar3) {
    GenerateReflectionInitializationCode(this,printer);
  }
  Namespace_abi_cxx11_
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(cpp *)this->file_,
             (FileDescriptor *)options,in_RCX);
  NamespaceOpener::NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count,
             (string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,(Formatter *)local_a8);
  std::__cxx11::string::~string
            ((string *)
             &ns.name_stack_.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  for (uVar4 = 0;
      puVar1 = (this->enum_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->enum_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar1 >> 3);
      uVar4 = uVar4 + 1) {
    EnumGenerator::GenerateMethods
              ((EnumGenerator *)
               puVar1[uVar4]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::EnumGenerator,_std::default_delete<google::protobuf::compiler::cpp::EnumGenerator>_>
               ._M_t,(int)uVar4,printer);
  }
  for (uVar4 = 0;
      puVar2 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      uVar4 < (ulong)((long)(this->extension_generators_).
                            super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 3);
      uVar4 = uVar4 + 1) {
    ExtensionGenerator::GenerateDefinition
              ((ExtensionGenerator *)
               puVar2[uVar4]._M_t.
               super___uniq_ptr_impl<google::protobuf::compiler::cpp::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::cpp::ExtensionGenerator>_>
               ._M_t,printer);
  }
  bVar3 = HasGenericServices(this->file_,options);
  if (bVar3) {
    for (uVar4 = 0;
        uVar4 < (ulong)((long)(this->service_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(this->service_generators_).
                              super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start >> 3); uVar4 = uVar4 + 1) {
      if (uVar4 == 0) {
        Formatter::operator()<>((Formatter *)local_a8,"\n");
      }
      Formatter::operator()<>
                ((Formatter *)local_a8,
                 "// ===================================================================\n");
      Formatter::operator()<>((Formatter *)local_a8,"\n");
      ServiceGenerator::GenerateImplementation
                ((ServiceGenerator *)
                 (this->service_generators_).
                 super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_t.
                 super___uniq_ptr_impl<google::protobuf::compiler::cpp::ServiceGenerator,_std::default_delete<google::protobuf::compiler::cpp::ServiceGenerator>_>
                 ._M_t,printer);
    }
  }
  NamespaceOpener::~NamespaceOpener
            ((NamespaceOpener *)&format.vars_._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&format);
  return;
}

Assistant:

void FileGenerator::GenerateGlobalSource(io::Printer* printer) {
  Formatter format(printer, variables_);
  GenerateSourceIncludes(printer);

  {
    GenerateTables(printer);

    // Define the code to initialize reflection. This code uses a global
    // constructor to register reflection data with the runtime pre-main.
    if (HasDescriptorMethods(file_, options_)) {
      GenerateReflectionInitializationCode(printer);
    }
  }

  NamespaceOpener ns(Namespace(file_, options_), format);

  // Generate enums.
  for (int i = 0; i < enum_generators_.size(); i++) {
    enum_generators_[i]->GenerateMethods(i, printer);
  }

  // Define extensions.
  for (int i = 0; i < extension_generators_.size(); i++) {
    extension_generators_[i]->GenerateDefinition(printer);
  }

  if (HasGenericServices(file_, options_)) {
    // Generate services.
    for (int i = 0; i < service_generators_.size(); i++) {
      if (i == 0) format("\n");
      format(kThickSeparator);
      format("\n");
      service_generators_[i]->GenerateImplementation(printer);
    }
  }
}